

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Stress::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  DrawTest *node;
  long *name;
  int iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  uint uVar6;
  deUint32 dVar7;
  deBool dVar8;
  int iVar9;
  _Rb_tree_color _Var10;
  _Rb_tree_color _Var11;
  CompatibilityTestType CVar12;
  int extraout_EAX;
  long lVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  ulong uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  deUint32 hash;
  Storage storages [2];
  DrawTestSpec spec;
  IndexType indexTypes [3];
  int firsts [3];
  int indexOffsets [3];
  int primitiveCounts [3];
  int attribCounts [3];
  UniformWeightArray<3> indexTypeWeights;
  float firstWeights [3];
  float indexOffsetWeights [3];
  float primitiveCountWeights [3];
  float attribWeights [3];
  DrawMethod drawMethods [5];
  int instanceDivisors [4];
  int strides [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  int instanceCounts [4];
  UniformWeightArray<5> drawMethodWeights;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  Primitive primitives [7];
  UniformWeightArray<7> primitiveWeights;
  Usage usages [9];
  float instanceDivisorWeights [4];
  float strideWeights [4];
  float offsetWeights [4];
  float instanceWeights [4];
  InputType inputTypes [11];
  UniformWeightArray<11> inputTypeWeights;
  OutputType outputTypes [12];
  UniformWeightArray<9> usageWeights;
  AttributeSpec attribSpec;
  Random random;
  UniformWeightArray<12> outputTypeWeights;
  _Rb_tree_color local_58c;
  Storage local_588 [2];
  undefined1 local_580 [56];
  pointer local_548;
  iterator local_540;
  AttributeSpec *local_538;
  DrawTest *local_530;
  TestNode *local_528;
  long local_520;
  float local_518 [2];
  long *local_510;
  long local_500 [2];
  IndexType local_4f0 [4];
  int local_4e0 [4];
  int local_4d0 [4];
  int local_4c0 [4];
  int local_4b0 [4];
  TestContext *local_4a0;
  RenderContext *local_498;
  ulong local_490;
  float local_488 [4];
  float local_478 [4];
  float local_468 [4];
  float local_458 [4];
  float local_448 [4];
  DrawMethod local_438 [8];
  int local_418 [12];
  float local_3e8 [4];
  int local_3d8 [14];
  float afStack_3a0 [6];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_388;
  Primitive local_358 [9];
  float local_334 [7];
  Usage local_318 [12];
  float local_2e8 [16];
  InputType local_2a8 [13];
  float local_274;
  InputType IStack_270;
  float afStack_26c [9];
  OutputType local_248 [14];
  float afStack_210 [10];
  AttributeSpec local_1e8 [2];
  ios_base local_178 [264];
  deRandom local_70;
  float local_60 [2];
  undefined8 auStack_58 [5];
  long lVar20;
  
  local_4b0[2] = 5;
  local_4b0[0] = 1;
  local_4b0[1] = 2;
  local_448[2] = 1.0;
  local_448[0] = 30.0;
  local_448[1] = 10.0;
  local_4c0[0] = 1;
  local_4c0[1] = 5;
  local_4c0[2] = 0x40;
  local_458[2] = 1.0;
  local_458[0] = 20.0;
  local_458[1] = 10.0;
  local_4d0[2] = 0xd;
  local_4d0[0] = 0;
  local_4d0[1] = 7;
  local_468[2] = 1.0;
  local_468[0] = 20.0;
  local_468[1] = 20.0;
  local_4e0[2] = 0xd;
  local_4e0[0] = 0;
  local_4e0[1] = 7;
  local_478[2] = 1.0;
  local_478[0] = 20.0;
  local_478[1] = 20.0;
  local_3d8[8] = 1;
  local_3d8[9] = 2;
  local_3d8[10] = 0x10;
  local_3d8[0xb] = 0x11;
  local_2e8[0xc] = 20.0;
  local_2e8[0xd] = 10.0;
  local_2e8[0xe] = 5.0;
  local_2e8[0xf] = 1.0;
  local_3d8[4] = 0;
  local_3d8[5] = 1;
  local_3d8[6] = 3;
  local_3d8[7] = 8;
  local_3d8[0] = 4;
  local_3d8[1] = 8;
  local_3d8[2] = 0x80;
  local_3d8[3] = 0x101;
  local_3e8[0] = 50.0;
  local_3e8[1] = 50.0;
  local_3e8[2] = 50.0;
  local_3e8[3] = 50.0;
  local_418[8] = 0;
  local_418[9] = 1;
  local_418[10] = 5;
  local_418[0xb] = 0xc;
  local_2e8[8] = 50.0;
  local_2e8[9] = 10.0;
  local_2e8[10] = 10.0;
  local_2e8[0xb] = 10.0;
  local_418[4] = 0;
  local_418[5] = 7;
  local_418[6] = 0x10;
  local_418[7] = 0x11;
  local_2e8[4] = 50.0;
  local_2e8[5] = 10.0;
  local_2e8[6] = 10.0;
  local_2e8[7] = 10.0;
  local_418[0] = 0;
  local_418[1] = 1;
  local_418[2] = 3;
  local_418[3] = 0x81;
  local_2e8[0] = 70.0;
  local_2e8[1] = 30.0;
  local_2e8[2] = 10.0;
  local_2e8[3] = 10.0;
  local_358[4] = 4;
  local_358[5] = PRIMITIVE_LINE_STRIP;
  local_358[6] = PRIMITIVE_LINE_LOOP;
  local_358[0] = PRIMITIVE_POINTS;
  local_358[1] = PRIMITIVE_TRIANGLES;
  local_358[2] = 2;
  local_358[3] = 3;
  local_334[0] = 1.0;
  local_334[1] = 1.0;
  local_334[2] = 1.0;
  local_334[3] = 1.0;
  local_334[4] = 1.0;
  local_334[5] = 1.0;
  local_334[6] = 1.0;
  local_438[4] = 5;
  local_438[0] = DRAWMETHOD_DRAWARRAYS;
  local_438[1] = DRAWMETHOD_DRAWARRAYS_INSTANCED;
  local_438[2] = DRAWMETHOD_DRAWELEMENTS;
  local_438[3] = DRAWMETHOD_DRAWELEMENTS_RANGED;
  lVar13 = 1;
  auVar21 = _DAT_00ada920;
  do {
    if (SUB164(auVar21 ^ _DAT_00ad8f80,4) == -0x80000000 &&
        SUB164(auVar21 ^ _DAT_00ad8f80,0) < -0x7ffffffb) {
      afStack_3a0[lVar13] = 1.0;
      afStack_3a0[lVar13 + 1] = 1.0;
    }
    lVar20 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 2;
    auVar21._8_8_ = lVar20 + 2;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 7);
  local_4f0[0] = INDEXTYPE_BYTE;
  local_4f0[1] = INDEXTYPE_SHORT;
  local_4f0[2] = 2;
  local_488[0] = 1.0;
  local_488[1] = 1.0;
  local_488[2] = 1.0;
  local_588[0] = STORAGE_USER;
  local_588[1] = STORAGE_BUFFER;
  local_518[0] = 1.0;
  local_518[1] = 1.0;
  local_2a8[8] = 9;
  local_2a8[9] = INPUTTYPE_UNSIGNED_INT_2_10_10_10;
  local_2a8[10] = INPUTTYPE_INT_2_10_10_10;
  local_2a8[4] = INPUTTYPE_UNSIGNED_BYTE;
  local_2a8[5] = INPUTTYPE_UNSIGNED_SHORT;
  local_2a8[6] = 7;
  local_2a8[7] = 8;
  local_2a8[0] = INPUTTYPE_FLOAT;
  local_2a8[1] = INPUTTYPE_FIXED;
  local_2a8[2] = INPUTTYPE_BYTE;
  local_2a8[3] = INPUTTYPE_SHORT;
  lVar13 = 3;
  auVar22 = _DAT_00ada910;
  auVar23 = _DAT_00ada920;
  do {
    if (SUB164(auVar23 ^ _DAT_00ad8f80,4) == -0x80000000 &&
        SUB164(auVar23 ^ _DAT_00ad8f80,0) < -0x7ffffff5) {
      local_2a8[lVar13 + 10] = 0x3f800000;
      local_2a8[lVar13 + 0xb] = 0x3f800000;
    }
    if (SUB164(auVar22 ^ _DAT_00ad8f80,4) == -0x80000000 &&
        SUB164(auVar22 ^ _DAT_00ad8f80,0) < -0x7ffffff5) {
      (&local_274)[lVar13 + -1] = 1.0;
      (&local_274)[lVar13] = 1.0;
    }
    lVar20 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 4;
    auVar23._8_8_ = lVar20 + 4;
    lVar20 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 4;
    auVar22._8_8_ = lVar20 + 4;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0xf);
  local_248[8] = OUTPUTTYPE_IVEC4;
  local_248[9] = OUTPUTTYPE_UVEC2;
  local_248[10] = OUTPUTTYPE_UVEC3;
  local_248[0xb] = OUTPUTTYPE_UVEC4;
  local_248[4] = OUTPUTTYPE_INT;
  local_248[5] = OUTPUTTYPE_UINT;
  local_248[6] = OUTPUTTYPE_IVEC2;
  local_248[7] = OUTPUTTYPE_IVEC3;
  local_248[0] = OUTPUTTYPE_FLOAT;
  local_248[1] = OUTPUTTYPE_VEC2;
  local_248[2] = OUTPUTTYPE_VEC3;
  local_248[3] = OUTPUTTYPE_VEC4;
  lVar13 = 0;
  do {
    *(undefined8 *)((long)auStack_58 + lVar13 * 4 + -8) = 0x3f8000003f800000;
    *(undefined8 *)((long)auStack_58 + lVar13 * 4) = 0x3f8000003f800000;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0xc);
  local_318[4] = USAGE_STREAM_COPY;
  local_318[5] = USAGE_STATIC_READ;
  local_318[6] = USAGE_STATIC_COPY;
  local_318[7] = USAGE_DYNAMIC_READ;
  local_318[0] = USAGE_DYNAMIC_DRAW;
  local_318[1] = USAGE_STATIC_DRAW;
  local_318[2] = USAGE_STREAM_DRAW;
  local_318[3] = USAGE_STREAM_READ;
  local_318[8] = 8;
  lVar13 = 1;
  auVar19 = _DAT_00ada920;
  do {
    if (SUB164(auVar19 ^ _DAT_00ad8f80,4) == -0x80000000 &&
        SUB164(auVar19 ^ _DAT_00ad8f80,0) < -0x7ffffff7) {
      afStack_210[lVar13] = 1.0;
      afStack_210[lVar13 + 1] = 1.0;
    }
    lVar20 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 2;
    auVar19._8_8_ = lVar20 + 2;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0xb);
  local_388._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_388._M_impl.super__Rb_tree_header._M_header;
  local_388._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar17 = 0;
  local_388._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_520 = 0;
  local_528 = (TestNode *)this;
  local_388._M_impl.super__Rb_tree_header._M_header._M_right =
       local_388._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    deRandom_init(&local_70,(int)uVar17 + 0xc551393);
    uVar6 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_70,local_4b0,local_4b0 + 3,local_448);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_580);
    local_580._0_4_ = 3;
    local_580._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)&local_70,local_358,local_358 + 7,local_334);
    local_580._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_4c0,local_4c0 + 3,local_458);
    local_580._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)&local_70,local_438,local_438 + 5,afStack_3a0 + 1);
    local_580._16_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                   ((Random *)&local_70,local_4f0,local_4f0 + 3,local_488);
    local_580._20_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_4d0,local_4d0 + 3,local_468);
    local_580._24_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage*,float_const*>
                   ((Random *)&local_70,local_588,(Storage *)local_580,local_518);
    local_580._28_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_4e0,local_4e0 + 3,local_478);
    local_580._32_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_3d8 + 4,local_3d8 + 8,local_3e8);
    local_580._36_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_3d8,local_3d8 + 4,local_3e8);
    local_580._40_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_3d8 + 8,local_3d8 + 0xc,local_2e8 + 0xc);
    bVar5 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_580);
    if (bVar5) {
      local_490 = uVar17;
      if (0 < (int)uVar6) {
        iVar18 = 0;
        do {
          deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(local_1e8);
          local_1e8[0].inputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                         ((Random *)&local_70,local_2a8,local_2a8 + 0xb,&local_274);
          local_1e8[0].outputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                         ((Random *)&local_70,local_248,local_248 + 0xc,local_60);
          local_1e8[0].storage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage*,float_const*>
                         ((Random *)&local_70,local_588,(Storage *)local_580,local_518);
          local_1e8[0].usage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                         ((Random *)&local_70,local_318,local_318 + 9,afStack_210 + 1);
          dVar7 = deRandom_getUint32(&local_70);
          local_1e8[0].componentCount = (dVar7 & 3) + 1;
          local_1e8[0].offset =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_70,local_418 + 8,(int *)local_3e8,local_2e8 + 8);
          local_1e8[0].stride =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_70,local_418 + 4,local_418 + 8,local_2e8 + 4);
          dVar8 = deRandom_getBool(&local_70);
          local_1e8[0].normalize = dVar8 == 1;
          local_1e8[0].instanceDivisor =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_70,local_418,local_418 + 4,local_2e8);
          dVar8 = deRandom_getBool(&local_70);
          local_1e8[0].useDefaultAttribute = dVar8 == 1;
          bVar5 = deqp::gls::DrawTestSpec::AttributeSpec::valid(local_1e8,(ApiType)local_580._0_4_);
          iVar3 = local_1e8[0].componentCount;
          if (local_1e8[0].stride == 0) {
            if (bVar5) goto LAB_00786804;
          }
          else {
            iVar9 = deqp::gls::DrawTestSpec::inputTypeSize(local_1e8[0].inputType);
            if (bVar5 && iVar9 * iVar3 <= local_1e8[0].stride) {
LAB_00786804:
              if (local_540._M_current == local_538) {
                std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                          ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                            *)&local_548,local_540,local_1e8);
              }
              else {
                (local_540._M_current)->instanceDivisor = local_1e8[0].instanceDivisor;
                (local_540._M_current)->useDefaultAttribute = (bool)(char)local_1e8[0]._36_4_;
                (local_540._M_current)->additionalPositionAttribute =
                     (bool)SUB41(local_1e8[0]._36_4_,1);
                (local_540._M_current)->bgraComponentOrder = (bool)SUB41(local_1e8[0]._36_4_,2);
                (local_540._M_current)->field_0x27 = SUB41(local_1e8[0]._36_4_,3);
                (local_540._M_current)->componentCount = local_1e8[0].componentCount;
                (local_540._M_current)->offset = local_1e8[0].offset;
                (local_540._M_current)->stride = local_1e8[0].stride;
                (local_540._M_current)->normalize = (bool)(char)local_1e8[0]._28_4_;
                *(int3 *)&(local_540._M_current)->field_0x1d = SUB43(local_1e8[0]._28_4_,1);
                (local_540._M_current)->inputType = local_1e8[0].inputType;
                (local_540._M_current)->outputType = local_1e8[0].outputType;
                (local_540._M_current)->storage = local_1e8[0].storage;
                (local_540._M_current)->usage = local_1e8[0].usage;
                local_540._M_current = local_540._M_current + 1;
              }
              iVar18 = iVar18 + 1;
            }
          }
        } while (iVar18 < (int)uVar6);
      }
      uVar17 = local_490;
      if (local_580._4_4_ != PRIMITIVE_POINTS) {
        local_548->instanceDivisor = 0;
      }
      if (((((local_580._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (local_580._4_4_ == PRIMITIVE_POINTS)) || (local_580._32_4_ != local_580._36_4_)) &&
          ((local_580._4_4_ == PRIMITIVE_POINTS || (local_548->useDefaultAttribute == false)))) &&
         ((2 < local_580._4_4_ - PRIMITIVE_TRIANGLES ||
          (((local_548->componentCount != 1 &&
            ((OUTPUTTYPE_UINT < local_548->outputType ||
             ((0x31U >> (local_548->outputType & 0x1f) & 1) == 0)))) &&
           ((local_580._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED ||
            (1 < (int)(local_580._36_4_ - local_580._32_4_))))))))) {
        _Var10 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_580);
        if (0 < (int)uVar6) {
          lVar13 = 0;
          do {
            local_58c = _Var10;
            _Var11 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                               ((AttributeSpec *)((long)&local_548->inputType + lVar13));
            _Var10 = _Var10 << 2 ^ _Var11;
            lVar13 = lVar13 + 0x28;
          } while ((ulong)uVar6 * 0x28 != lVar13);
        }
        local_58c = _Var10;
        if (local_388._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var4 = local_388._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var16 = &local_388._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var15 = p_Var16;
            p_Var14 = p_Var4;
            _Var11 = p_Var14[1]._M_color;
            p_Var16 = p_Var14;
            if (_Var11 < _Var10) {
              p_Var16 = p_Var15;
            }
            p_Var4 = (&p_Var14->_M_left)[_Var11 < _Var10];
          } while ((&p_Var14->_M_left)[_Var11 < _Var10] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var16 != &local_388._M_impl.super__Rb_tree_header) {
            if (_Var11 < _Var10) {
              p_Var14 = p_Var15;
            }
            if (p_Var14[1]._M_color <= _Var10) goto LAB_00786ad3;
          }
        }
        CVar12 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_580);
        if ((CVar12 == COMPATIBILITY_UNALIGNED_OFFSET) ||
           (CVar12 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_580),
           CVar12 == COMPATIBILITY_UNALIGNED_STRIDE)) {
          local_530 = (DrawTest *)operator_new(0x138);
          pTVar1 = local_528->m_testCtx;
          pRVar2 = ((Context *)local_528[1]._vptr_TestNode)->m_renderCtx;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          local_498 = pRVar2;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
          std::__cxx11::stringbuf::str();
          local_4a0 = pTVar1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          name = local_510;
          deqp::gls::DrawTestSpec::getDesc_abi_cxx11_((string *)local_1e8,(DrawTestSpec *)local_580)
          ;
          node = local_530;
          deqp::gls::DrawTest::DrawTest
                    (local_530,local_4a0,local_498,(DrawTestSpec *)local_580,(char *)name,
                     (char *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType));
          tcu::TestNode::addChild(local_528,(TestNode *)node);
          if ((int *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType) !=
              &local_1e8[0].componentCount) {
            operator_delete((undefined1 *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType),
                            CONCAT44(local_1e8[0].offset,local_1e8[0].componentCount) + 1);
          }
          if (local_510 != local_500) {
            operator_delete(local_510,local_500[0] + 1);
          }
        }
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_388,&local_58c);
        local_520 = local_520 + 1;
      }
    }
LAB_00786ad3:
    if (local_548 != (pointer)0x0) {
      operator_delete(local_548,(long)local_538 - (long)local_548);
    }
    uVar6 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar6;
    if (uVar6 == 300) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_388);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 300;

	const int	attribCounts[]			= { 1, 2, 5 };
	const float	attribWeights[]			= { 30, 10, 1 };
	const int	primitiveCounts[]		= { 1, 5, 64 };
	const float	primitiveCountWeights[]	= { 20, 10, 1 };
	const int	indexOffsets[]			= { 0, 7, 13 };
	const float	indexOffsetWeights[]	= { 20, 20, 1 };
	const int	firsts[]				= { 0, 7, 13 };
	const float	firstWeights[]			= { 20, 20, 1 };
	const int	instanceCounts[]		= { 1, 2, 16, 17 };
	const float	instanceWeights[]		= { 20, 10, 5, 1 };
	const int	indexMins[]				= { 0, 1, 3, 8 };
	const int	indexMaxs[]				= { 4, 8, 128, 257 };
	const float	indexWeights[]			= { 50, 50, 50, 50 };
	const int	offsets[]				= { 0, 1, 5, 12 };
	const float	offsetWeights[]			= { 50, 10, 10, 10 };
	const int	strides[]				= { 0, 7, 16, 17 };
	const float	strideWeights[]			= { 50, 10, 10, 10 };
	const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only unaligned cases
				if (spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
					spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}